

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

uint * Gia_ManTerStateCreate(Gia_ManTer_t *p)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  uint *puVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  uint *puVar8;
  void **ppvVar9;
  int iVar10;
  int **ppiVar11;
  uint uVar12;
  byte bVar13;
  long lVar14;
  uint uVar15;
  
  iVar2 = p->pAig->nRegs;
  pVVar4 = p->pAig->vCis;
  iVar3 = pVVar4->nSize;
  puVar8 = (uint *)calloc((long)p->nStateWords * 4 + 8,1);
  if (0 < iVar2) {
    iVar10 = iVar3 - iVar2;
    puVar5 = p->pDataSimCis;
    bVar13 = 0;
    lVar14 = 0;
    do {
      iVar7 = (int)lVar14;
      uVar12 = puVar5[iVar10 + iVar7 >> 4] >>
               ((char)iVar3 * '\x02' + (char)iVar2 * -2 + bVar13 & 0x1e);
      uVar15 = uVar12 & 3;
      if (uVar15 == 0) {
        __assert_fail("Value >= GIA_ZER && Value <= GIA_UND",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTsim.c"
                      ,0x24,"void Gia_ManTerSimInfoSet(unsigned int *, int, int)");
      }
      puVar8[iVar7 >> 4] =
           ((puVar8[iVar7 >> 4] >> (bVar13 & 0x1e) ^ uVar12) & 3) << (bVar13 & 0x1e) ^
           puVar8[iVar7 >> 4];
      ppiVar11 = &p->pCount0;
      if ((uVar15 == 1) || (ppiVar11 = &p->pCountX, uVar15 == 3)) {
        (*ppiVar11)[iVar7] = (*ppiVar11)[iVar7] + 1;
      }
      bVar13 = bVar13 + 2;
      lVar1 = iVar10 + lVar14;
      lVar14 = lVar14 + 1;
    } while (lVar1 + 1 < (long)pVVar4->nSize);
  }
  pVVar6 = p->vStates;
  uVar12 = pVVar6->nSize;
  if (uVar12 == pVVar6->nCap) {
    if ((int)uVar12 < 0x10) {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar9 = (void **)malloc(0x80);
      }
      else {
        ppvVar9 = (void **)realloc(pVVar6->pArray,0x80);
      }
      pVVar6->pArray = ppvVar9;
      pVVar6->nCap = 0x10;
    }
    else {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar9 = (void **)malloc((ulong)uVar12 << 4);
      }
      else {
        ppvVar9 = (void **)realloc(pVVar6->pArray,(ulong)uVar12 << 4);
      }
      pVVar6->pArray = ppvVar9;
      pVVar6->nCap = uVar12 * 2;
    }
  }
  else {
    ppvVar9 = pVVar6->pArray;
  }
  iVar2 = pVVar6->nSize;
  pVVar6->nSize = iVar2 + 1;
  ppvVar9[iVar2] = puVar8;
  return puVar8;
}

Assistant:

unsigned * Gia_ManTerStateCreate( Gia_ManTer_t * p )
{
    int i, Value, nPis = Gia_ManPiNum(p->pAig);
    unsigned * pRes = Gia_ManTerStateAlloc( p->nStateWords );
    for ( i = nPis; i < Gia_ManCiNum(p->pAig); i++ )
    {
        Value = Gia_ManTerSimInfoGet( p->pDataSimCis, i );
        Gia_ManTerSimInfoSet( pRes, i-nPis, Value );
        if ( Value == GIA_ZER )
            p->pCount0[i-nPis]++;
        if ( Value == GIA_UND )
            p->pCountX[i-nPis]++;
    }
    Vec_PtrPush( p->vStates, pRes );
    return pRes;    
}